

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O2

void __thiscall rtosc::helpers::Capture::map_blobs(Capture *this)

{
  rtosc_arg_val_t *prVar1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  int i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < this->nargs; lVar2 = lVar2 + 1) {
    prVar1 = this->arg_vals;
    if ((((&prVar1->type)[lVar3] == 'b') && (*(long *)((long)&prVar1->val + lVar3 + 8) != 0)) &&
       (*(int *)((long)&prVar1->val + lVar3) != 0)) {
      this_00 = this->scratch_bufs;
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::resize(this_00,(*(long *)(this_00 + 8) - *(long *)this_00) / 0x18 + 1);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)(*(long *)(this->scratch_bufs + 8) + -0x18),
                 (long)*(int *)((long)&this->arg_vals->val + lVar3));
      std::
      copy_n<unsigned_char*,int,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                (*(uchar **)((long)&this->arg_vals->val + lVar3 + 8),
                 *(int *)((long)&this->arg_vals->val + lVar3),
                 (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                 *(char **)(*(long *)(this->scratch_bufs + 8) + -0x18));
      *(undefined8 *)((long)&this->arg_vals->val + lVar3 + 8) =
           *(undefined8 *)(*(long *)(this->scratch_bufs + 8) + -0x18);
    }
    lVar3 = lVar3 + 0x18;
  }
  return;
}

Assistant:

void map_blobs()
    {
        for(int i = 0; i < nargs; ++i)
        {
            if(arg_vals[i].type == 'b'
               && arg_vals[i].val.b.data && arg_vals[i].val.b.len)
            {
                scratch_bufs->resize(scratch_bufs->size()+1);
                scratch_bufs->back().resize(arg_vals[i].val.b.len);
                std::copy_n(arg_vals[i].val.b.data,
                            arg_vals[i].val.b.len,
                            scratch_bufs->back().begin());
                arg_vals[i].val.b.data = (uint8_t*)scratch_bufs->back().data();
            }
        }
    }